

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
* myvk::CommandBuffer::CreateMultiple
            (Ptr<CommandPool> *command_pool,uint32_t count,VkCommandBufferLevel level)

{
  value_type pVVar1;
  PFN_vkAllocateCommandBuffers p_Var2;
  VkResult VVar3;
  element_type *peVar4;
  element_type *this;
  VkDevice pVVar5;
  VkCommandBuffer_T **ppVVar6;
  reference ppVVar7;
  element_type *peVar8;
  uint in_EDX;
  shared_ptr<myvk::CommandBuffer> *in_RSI;
  vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
  *in_RDI;
  shared_ptr<myvk::CommandBuffer> ptr;
  uint32_t i;
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> handles;
  VkCommandBufferAllocateInfo alloc_info;
  vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
  *ret;
  shared_ptr<myvk::CommandBuffer> *in_stack_ffffffffffffff18;
  shared_ptr<myvk::CommandBuffer> *this_00;
  allocator_type *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  allocator<std::shared_ptr<myvk::CommandBuffer>_> *__n;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint local_70;
  allocator<std::shared_ptr<myvk::CommandBuffer>_> local_6a;
  undefined1 local_69;
  undefined4 local_68;
  allocator<VkCommandBuffer_T_*> local_51;
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> local_50;
  VkCommandBufferAllocateInfo local_38;
  uint local_14;
  shared_ptr<myvk::CommandBuffer> *local_10;
  
  local_38.commandPool = (VkCommandPool)0x0;
  local_38.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  local_38.commandBufferCount = 0;
  local_38.pNext = (void *)0x0;
  local_38.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_38._4_4_ = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  peVar4 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ab66d);
  local_38.commandPool = CommandPool::GetHandle(peVar4);
  std::allocator<VkCommandBuffer_T_*>::allocator((allocator<VkCommandBuffer_T_*> *)0x2ab6b7);
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::vector
            ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
             ,(allocator_type *)in_stack_ffffffffffffff30);
  std::allocator<VkCommandBuffer_T_*>::~allocator(&local_51);
  p_Var2 = vkAllocateCommandBuffers;
  peVar4 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ab6f9);
  (*(peVar4->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x2ab716);
  pVVar5 = Device::GetHandle(this);
  ppVVar6 = std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::data
                      ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)0x2ab732
                      );
  VVar3 = (*p_Var2)(pVVar5,&local_38,ppVVar6);
  if (VVar3 == VK_SUCCESS) {
    local_69 = 0;
    in_stack_ffffffffffffff30 = (allocator_type *)(ulong)local_14;
    __n = &local_6a;
    std::allocator<std::shared_ptr<myvk::CommandBuffer>_>::allocator
              ((allocator<std::shared_ptr<myvk::CommandBuffer>_> *)0x2ab7e2);
    std::
    vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    ::vector((vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
              *)CONCAT44(VVar3,in_stack_ffffffffffffff40),(size_type)__n,in_stack_ffffffffffffff30);
    std::allocator<std::shared_ptr<myvk::CommandBuffer>_>::~allocator(&local_6a);
    for (local_70 = 0; local_70 < local_14; local_70 = local_70 + 1) {
      std::make_shared<myvk::CommandBuffer>();
      this_00 = local_10;
      std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ab83e);
      std::shared_ptr<myvk::CommandPool>::operator=
                ((shared_ptr<myvk::CommandPool> *)this_00,
                 (shared_ptr<myvk::CommandPool> *)in_stack_ffffffffffffff18);
      ppVVar7 = std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::operator[]
                          (&local_50,(ulong)local_70);
      pVVar1 = *ppVVar7;
      peVar8 = std::
               __shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ab874);
      peVar8->m_command_buffer = pVVar1;
      std::
      vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
      ::operator[](in_RDI,(ulong)local_70);
      std::shared_ptr<myvk::CommandBuffer>::operator=(this_00,in_stack_ffffffffffffff18);
      std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x2ab8a4)
      ;
    }
    local_69 = 1;
  }
  else {
    memset(in_RDI,0,0x18);
    std::
    vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    ::vector((vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
              *)0x2ab773);
  }
  local_68 = 1;
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::~vector
            ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
             in_stack_ffffffffffffff30);
  return in_RDI;
}

Assistant:

std::vector<Ptr<CommandBuffer>> CommandBuffer::CreateMultiple(const Ptr<CommandPool> &command_pool, uint32_t count,
                                                              VkCommandBufferLevel level) {
	VkCommandBufferAllocateInfo alloc_info = {};
	alloc_info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
	alloc_info.commandPool = command_pool->GetHandle();
	alloc_info.level = level;
	alloc_info.commandBufferCount = count;

	std::vector<VkCommandBuffer> handles(count);

	if (vkAllocateCommandBuffers(command_pool->GetDevicePtr()->GetHandle(), &alloc_info, handles.data()) != VK_SUCCESS)
		return {};

	std::vector<Ptr<CommandBuffer>> ret(count);
	for (uint32_t i = 0; i < count; ++i) {
		auto ptr = std::make_shared<CommandBuffer>();
		ptr->m_command_pool_ptr = command_pool;
		ptr->m_command_buffer = handles[i];
		ret[i] = ptr;
	}

	return ret;
}